

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ValuesInIteratorRangeGenerator<BloatyTestEntry>::Iterator::Iterator
          (Iterator *this,Iterator *other)

{
  unique_ptr<const_BloatyTestEntry,_std::default_delete<const_BloatyTestEntry>_> *in_RSI;
  ParamIteratorInterface<BloatyTestEntry> *in_RDI;
  
  memset(in_RDI,0,8);
  ParamIteratorInterface<BloatyTestEntry>::ParamIteratorInterface(in_RDI);
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_00911278;
  in_RDI[1]._vptr_ParamIteratorInterface =
       (_func_int **)
       in_RSI[1]._M_t.
       super___uniq_ptr_impl<const_BloatyTestEntry,_std::default_delete<const_BloatyTestEntry>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_BloatyTestEntry_*,_std::default_delete<const_BloatyTestEntry>_>.
       super__Head_base<0UL,_const_BloatyTestEntry_*,_false>._M_head_impl;
  in_RDI[2]._vptr_ParamIteratorInterface =
       (_func_int **)
       in_RSI[2]._M_t.
       super___uniq_ptr_impl<const_BloatyTestEntry,_std::default_delete<const_BloatyTestEntry>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_BloatyTestEntry_*,_std::default_delete<const_BloatyTestEntry>_>.
       super__Head_base<0UL,_const_BloatyTestEntry_*,_false>._M_head_impl;
  std::unique_ptr<BloatyTestEntry_const,std::default_delete<BloatyTestEntry_const>>::
  unique_ptr<std::default_delete<BloatyTestEntry_const>,void>(in_RSI);
  return;
}

Assistant:

Iterator(const Iterator& other)
          // The explicit constructor call suppresses a false warning
          // emitted by gcc when supplied with the -Wextra option.
        : ParamIteratorInterface<T>(),
          base_(other.base_),
          iterator_(other.iterator_) {}